

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O2

void PackRGB_C(uint8_t *r,uint8_t *g,uint8_t *b,int len,int step,uint32_t *out)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)len;
  if (len < 1) {
    uVar1 = uVar2;
  }
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    out[uVar3] = (uint)g[uVar2] << 8 | (uint)r[uVar2] << 0x10 | (uint)b[uVar2] | 0xff000000;
    uVar2 = uVar2 + (long)step;
  }
  return;
}

Assistant:

static void PackRGB_C(const uint8_t* WEBP_RESTRICT r,
                      const uint8_t* WEBP_RESTRICT g,
                      const uint8_t* WEBP_RESTRICT b,
                      int len, int step, uint32_t* WEBP_RESTRICT out) {
  int i, offset = 0;
  for (i = 0; i < len; ++i) {
    out[i] = MakeARGB32(0xff, r[offset], g[offset], b[offset]);
    offset += step;
  }
}